

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O3

void Saig_ManDetectConstrFuncTest
               (Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fOldAlgo,int fVerbose)

{
  void *__ptr;
  int iVar1;
  Vec_Vec_t *__ptr_00;
  long lVar2;
  
  if (fOldAlgo == 0) {
    __ptr_00 = Ssw_ManFindDirectImplications(p,nFrames,nConfs,nProps,fVerbose);
  }
  else {
    __ptr_00 = Saig_ManDetectConstrFunc(p,nFrames,nConfs,nProps,fVerbose);
  }
  if (__ptr_00 != (Vec_Vec_t *)0x0) {
    iVar1 = __ptr_00->nSize;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        __ptr = __ptr_00->pArray[lVar2];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
          }
          free(__ptr);
          iVar1 = __ptr_00->nSize;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
    }
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void Saig_ManDetectConstrFuncTest( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fOldAlgo, int fVerbose )
{
    Vec_Vec_t * vCands;
    if ( fOldAlgo )
        vCands = Saig_ManDetectConstrFunc( p, nFrames, nConfs, nProps, fVerbose );
    else
        vCands = Ssw_ManFindDirectImplications( p, nFrames, nConfs, nProps, fVerbose );
    Vec_VecFreeP( &vCands );
}